

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

ostream * yyml::operator<<(ostream *os,Tensor<double> *v)

{
  size_t sVar1;
  ostream *poVar2;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    sVar1 = (v->shape_).total;
    poVar2 = std::ostream::_M_insert<double>(v->data_[uVar3]);
    if (sVar1 - 1 <= uVar3) break;
    std::operator<<(poVar2,' ');
    uVar3 = uVar3 + 1;
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Tensor& v) {
    size_t i;
    for (i = 0; i < v.shape_.total - 1; i++) {
      os << v.data_[i] << ' ';
    }
    os << v.data_[i];
    return os;
  }